

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# val_PersonHandle.cpp
# Opt level: O0

int __thiscall mbc::Val::PersonHandle::init(PersonHandle *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  istream *piVar2;
  PersonHandle *pPVar3;
  string local_4d8;
  allocator local_4b1;
  string local_4b0;
  string local_490;
  allocator local_469;
  string local_468;
  string local_448;
  allocator local_421;
  string local_420;
  string local_400;
  allocator local_3d9;
  string local_3d8;
  string local_3b8;
  allocator local_391;
  string local_390;
  string local_370;
  allocator local_349;
  string local_348;
  string local_328;
  allocator local_301;
  string local_300;
  string local_2e0;
  allocator local_2b9;
  string local_2b8;
  allocator local_291;
  string local_290;
  allocator local_269;
  string local_268;
  allocator local_241;
  string local_240;
  allocator local_219;
  string local_218;
  allocator local_1f1;
  string local_1f0;
  allocator local_1c9;
  string local_1c8;
  allocator local_1a1;
  string local_1a0;
  allocator local_179;
  string local_178;
  allocator local_141;
  string local_140;
  string local_120 [8];
  string classes;
  string qq_number;
  string email;
  string mail_number;
  string location;
  string telephone;
  string sex;
  string name;
  Input input;
  PersonHandle *this_local;
  
  units::Input::Input((Input *)((long)&name.field_2 + 8),(istream *)&std::cin,(ostream *)&std::cout)
  ;
  std::__cxx11::string::string((string *)(sex.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(telephone.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(location.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(mail_number.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(email.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(qq_number.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(classes.field_2._M_local_buf + 8));
  std::__cxx11::string::string(local_120);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_140," | please enter name",&local_141);
  piVar2 = units::Input::operator()((Input *)((long)&name.field_2 + 8),&local_140);
  std::operator>>(piVar2,(string *)(sex.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator((allocator<char> *)&local_141);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_178," | please enter sex [M/F]",&local_179);
  piVar2 = units::Input::operator()((Input *)((long)&name.field_2 + 8),&local_178);
  std::operator>>(piVar2,(string *)(telephone.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_178);
  std::allocator<char>::~allocator((allocator<char> *)&local_179);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1a0," | please enter telephone [only include digit]",&local_1a1);
  piVar2 = units::Input::operator()((Input *)((long)&name.field_2 + 8),&local_1a0);
  std::operator>>(piVar2,(string *)(location.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_1a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1c8," | please enter location",&local_1c9);
  piVar2 = units::Input::operator()((Input *)((long)&name.field_2 + 8),&local_1c8);
  std::operator>>(piVar2,(string *)(mail_number.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1f0," | please enter postal number [6-length number]",&local_1f1);
  piVar2 = units::Input::operator()((Input *)((long)&name.field_2 + 8),&local_1f0);
  std::operator>>(piVar2,(string *)(email.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_1f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_218," | please enter email",&local_219);
  piVar2 = units::Input::operator()((Input *)((long)&name.field_2 + 8),&local_218);
  std::operator>>(piVar2,(string *)(qq_number.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_218);
  std::allocator<char>::~allocator((allocator<char> *)&local_219);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_240," | please enter qq number",&local_241);
  piVar2 = units::Input::operator()((Input *)((long)&name.field_2 + 8),&local_240);
  std::operator>>(piVar2,(string *)(classes.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_240);
  std::allocator<char>::~allocator((allocator<char> *)&local_241);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_268," | please enter classes",&local_269);
  units::Input::operator()((Input *)((long)&name.field_2 + 8),&local_268);
  std::__cxx11::string::~string((string *)&local_268);
  std::allocator<char>::~allocator((allocator<char> *)&local_269);
  std::istream::operator>>(&std::cin,std::ws<char,std::char_traits<char>>);
  std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&std::cin,local_120);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_290," | ",&local_291);
  units::Input::operator()((Input *)((long)&name.field_2 + 8),&local_290);
  std::__cxx11::string::~string((string *)&local_290);
  std::allocator<char>::~allocator((allocator<char> *)&local_291);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2b8,"name",&local_2b9);
  std::__cxx11::string::string((string *)&local_2e0,(string *)(sex.field_2._M_local_buf + 8));
  pPVar3 = changeAttr(this,&local_2b8,&local_2e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_300,"sex",&local_301);
  std::__cxx11::string::string((string *)&local_328,(string *)(telephone.field_2._M_local_buf + 8));
  pPVar3 = changeAttr(pPVar3,&local_300,&local_328);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_348,"telephone",&local_349);
  std::__cxx11::string::string((string *)&local_370,(string *)(location.field_2._M_local_buf + 8));
  pPVar3 = changeAttr(pPVar3,&local_348,&local_370);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_390,"location",&local_391);
  std::__cxx11::string::string
            ((string *)&local_3b8,(string *)(mail_number.field_2._M_local_buf + 8));
  pPVar3 = changeAttr(pPVar3,&local_390,&local_3b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3d8,"mail_number",&local_3d9);
  std::__cxx11::string::string((string *)&local_400,(string *)(email.field_2._M_local_buf + 8));
  pPVar3 = changeAttr(pPVar3,&local_3d8,&local_400);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_420,"email",&local_421);
  std::__cxx11::string::string((string *)&local_448,(string *)(qq_number.field_2._M_local_buf + 8));
  pPVar3 = changeAttr(pPVar3,&local_420,&local_448);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_468,"qq_number",&local_469);
  std::__cxx11::string::string((string *)&local_490,(string *)(classes.field_2._M_local_buf + 8));
  pPVar3 = changeAttr(pPVar3,&local_468,&local_490);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_4b0,"classes",&local_4b1);
  std::__cxx11::string::string((string *)&local_4d8,local_120);
  changeAttr(pPVar3,&local_4b0,&local_4d8);
  std::__cxx11::string::~string((string *)&local_4d8);
  std::__cxx11::string::~string((string *)&local_4b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4b1);
  std::__cxx11::string::~string((string *)&local_490);
  std::__cxx11::string::~string((string *)&local_468);
  std::allocator<char>::~allocator((allocator<char> *)&local_469);
  std::__cxx11::string::~string((string *)&local_448);
  std::__cxx11::string::~string((string *)&local_420);
  std::allocator<char>::~allocator((allocator<char> *)&local_421);
  std::__cxx11::string::~string((string *)&local_400);
  std::__cxx11::string::~string((string *)&local_3d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3d9);
  std::__cxx11::string::~string((string *)&local_3b8);
  std::__cxx11::string::~string((string *)&local_390);
  std::allocator<char>::~allocator((allocator<char> *)&local_391);
  std::__cxx11::string::~string((string *)&local_370);
  std::__cxx11::string::~string((string *)&local_348);
  std::allocator<char>::~allocator((allocator<char> *)&local_349);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_300);
  std::allocator<char>::~allocator((allocator<char> *)&local_301);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
  std::__cxx11::string::~string(local_120);
  std::__cxx11::string::~string((string *)(classes.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(qq_number.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(email.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(mail_number.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(location.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(telephone.field_2._M_local_buf + 8));
  iVar1 = std::__cxx11::string::~string((string *)(sex.field_2._M_local_buf + 8));
  return iVar1;
}

Assistant:

void PersonHandle::init() {
    units::Input input(std::cin, std::cout);
    string name, sex, telephone, location, mail_number, email, qq_number, classes;

    input(" | please enter name") >> name;
    input(" | please enter sex [M/F]") >> sex;;
    input(" | please enter telephone [only include digit]") >> telephone;
    input(" | please enter location") >> location;
    input(" | please enter postal number [6-length number]") >> mail_number;
    input(" | please enter email") >> email;
    input(" | please enter qq number") >> qq_number;
    input(" | please enter classes");
    std::cin >> std::ws;
    std::getline(std::cin, classes);
    input(" | ");

    (*this)
        .changeAttr("name", name)
        .changeAttr("sex",  sex)
        .changeAttr("telephone", telephone)
        .changeAttr("location", location)
        .changeAttr("mail_number", mail_number)
        .changeAttr("email", email)
        .changeAttr("qq_number", qq_number)
        .changeAttr("classes", classes)
    ;

    return;
}